

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

BOOL __thiscall
Js::CustomExternalWrapperObject::SetProperty
          (CustomExternalWrapperObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  Attributes attributes;
  JavascriptFunction *function;
  undefined4 *puVar8;
  JavascriptMethod p_Var9;
  RecyclableObject *ptr;
  Var pvVar10;
  
  BVar7 = VerifyObjectAlive(this);
  if (BVar7 == 0) {
    return 0;
  }
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = pSVar2->threadContext;
  BVar7 = EnsureInitialized(this,pSVar2);
  if (BVar7 == 0) {
    return 0;
  }
  pTVar3 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar10 = *(Var *)&(pTVar3[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar10 == (Var)0x0) {
    pvVar10 = CrossSite::MarshalVar
                        ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                         scriptContext.ptr,value,false);
    BVar7 = DynamicObject::SetProperty
                      (&this->super_DynamicObject,propertyNameString,pvVar10,flags,info);
    return BVar7;
  }
  function = VarTo<Js::JavascriptFunction>(pvVar10);
  bVar5 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  if (function == (JavascriptFunction *)0x0) {
    return 0;
  }
  bVar5 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar6 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar6) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,this
                    ,propertyNameString);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00b44350;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,
                      this,propertyNameString);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00b44350;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,this
                    ,propertyNameString);
    bVar6 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar6 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00b44350:
  this_00->reentrancySafeOrHandled = bVar5;
  BVar7 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  return BVar7;
}

Assistant:

BOOL CustomExternalWrapperObject::SetProperty(Js::JavascriptString* propertyNameString, Js::Var value, Js::PropertyOperationFlags flags, Js::PropertyValueInfo* info)
{
    if (!this->VerifyObjectAlive()) return FALSE;
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return propertyNameString;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    };

    return SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetPropertyKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, info);
}